

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf262.c
# Opt level: O2

void ymf262_set_mute_mask(void *chip,UINT32 MuteMask)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)chip + 0x10e;
  for (lVar2 = 0; lVar2 != 0x12; lVar2 = lVar2 + 1) {
    *(bool *)lVar1 = (MuteMask >> ((uint)lVar2 & 0x1f) & 1) != 0;
    lVar1 = lVar1 + 0xf0;
  }
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    *(bool *)((long)chip + lVar1 + 0x1268) = (MuteMask >> ((int)lVar1 + 0x12U & 0x1f) & 1) != 0;
  }
  return;
}

Assistant:

void ymf262_set_mute_mask(void *chip, UINT32 MuteMask)
{
	OPL3 *opl3 = (OPL3 *)chip;
	UINT8 CurChn;
	
	for (CurChn = 0; CurChn < 18; CurChn ++)
		opl3->P_CH[CurChn].Muted = (MuteMask >> CurChn) & 0x01;
	for (CurChn = 0; CurChn < 5; CurChn ++)
		opl3->MuteSpc[CurChn] = (MuteMask >> (CurChn + 18)) & 0x01;
	
	return;
}